

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-terrain.cpp
# Opt level: O1

void configureTerrainProgram(void)

{
  float fVar1;
  
  fVar1 = tanf(((g_camera.fovy * 3.1415927) / 180.0) * 0.5);
  fVar1 = ((fVar1 + fVar1) / (float)g_framebuffer.w) *
          (float)(1 << ((byte)g_terrain.gpuSubd & 0x1f)) * g_terrain.primitivePixelLengthTarget;
  (*glad_glProgramUniform1i)(g_gl.programs[2],g_gl.uniforms[7],3);
  (*glad_glProgramUniform1i)(g_gl.programs[2],g_gl.uniforms[8],4);
  (*glad_glProgramUniform1f)(g_gl.programs[2],g_gl.uniforms[9],g_terrain.dmap.scale);
  (*glad_glProgramUniform1f)(g_gl.programs[2],g_gl.uniforms[10],fVar1);
  return;
}

Assistant:

float radians(float degrees)
{
    return degrees * M_PI / 180.f;
}